

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O2

void Cnf_CutDeref(Cnf_Man_t *p,Cnf_Cut_t *pCut)

{
  ulong uVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (pCut->nFanins <= lVar3) {
      return;
    }
    pAVar2 = Aig_ManObj(p->pManAig,*(int *)((long)pCut[1].vIsop + lVar3 * 4 + -8));
    if (pAVar2 == (Aig_Obj_t *)0x0) break;
    uVar1 = *(ulong *)&pAVar2->field_0x18;
    if ((uVar1 & 0xffffffc0) == 0) {
      __assert_fail("pObj->nRefs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfCut.c"
                    ,0x8d,"void Cnf_CutDeref(Cnf_Man_t *, Cnf_Cut_t *)");
    }
    *(ulong *)&pAVar2->field_0x18 =
         uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 - 0x40U & 0xffffffc0);
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void Cnf_CutDeref( Cnf_Man_t * p, Cnf_Cut_t * pCut )
{
    Aig_Obj_t * pObj;
    int i;
    Cnf_CutForEachLeaf( p->pManAig, pCut, pObj, i )
    {
        assert( pObj->nRefs > 0 );
        pObj->nRefs--;
    }
}